

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

bool __thiscall cinatra::uri_t::parse_from(uri_t *this,char *encoded)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *uinfo_begin;
  long lVar9;
  char *pcVar10;
  size_type __rlen;
  size_t sVar11;
  long lVar12;
  bool bVar13;
  
  for (pcVar5 = encoded; (cVar1 = *pcVar5, cVar1 != '\0' && (cVar1 != '/')); pcVar5 = pcVar5 + 1) {
    if (cVar1 == ':') {
      iVar4 = isalpha((int)*encoded);
      if (iVar4 == 0) {
        return false;
      }
      bVar2 = encoded[1];
      pcVar7 = encoded + 1;
      pcVar5 = encoded;
      goto joined_r0x001d5ebd;
    }
  }
  goto LAB_001d5f68;
joined_r0x001d5ebd:
  pcVar10 = pcVar7;
  if (bVar2 == 0x3a) goto LAB_001d5f00;
  iVar4 = isalnum((int)(char)bVar2);
  if ((iVar4 == 0) && ((0x2e < bVar2 || ((0x680000000000U >> ((ulong)bVar2 & 0x3f) & 1) == 0))))
  goto LAB_001d5f5b;
  bVar2 = pcVar10[1];
  pcVar7 = pcVar10 + 1;
  pcVar5 = pcVar10;
  goto joined_r0x001d5ebd;
  while (lVar9 = lVar12, (int)*pcVar6 - 0x30U < 10) {
LAB_001d60e5:
    pcVar6 = pcVar10 + -2;
    sVar11 = sVar11 + 1;
    pcVar10 = pcVar10 + -1;
    lVar12 = lVar9 + 1;
    if (lVar9 == -1) break;
  }
  pcVar8 = pcVar5;
  if (*pcVar6 == ':') {
    pcVar8 = pcVar7 + -lVar12;
    (this->port)._M_len = sVar11;
    (this->port)._M_str = pcVar10;
  }
  lVar9 = 1;
  pcVar10 = pcVar7;
  do {
    pcVar6 = pcVar10;
    bVar13 = is_user_info_character(this,(int)*pcVar6);
    lVar9 = lVar9 + -1;
    if (pcVar6 == pcVar8) break;
    pcVar10 = pcVar6 + 1;
  } while (bVar13);
  if (*pcVar6 == '@') {
    (this->uinfo)._M_len = -lVar9;
    (this->uinfo)._M_str = pcVar7;
    pcVar7 = pcVar6 + 1;
  }
  (this->host)._M_len = (long)pcVar8 - (long)pcVar7;
  (this->host)._M_str = pcVar7;
  goto LAB_001d5fca;
LAB_001d5f00:
  sVar11 = (long)pcVar10 - (long)encoded;
  (this->schema)._M_len = sVar11;
  (this->schema)._M_str = encoded;
  if (sVar11 == 3) {
    iVar4 = bcmp(encoded,"wss",3);
    bVar13 = iVar4 == 0;
  }
  else if ((sVar11 == 5) && (iVar4 = bcmp(encoded,"https",5), iVar4 == 0)) {
    bVar13 = true;
  }
  else {
    bVar13 = false;
  }
  this->is_ssl = bVar13;
  pcVar10 = pcVar5 + 2;
LAB_001d5f5b:
  encoded = pcVar10;
  if (bVar2 != 0x3a) {
    return false;
  }
LAB_001d5f68:
  if ((this->schema)._M_len != 0) {
    pcVar5 = encoded;
    if ((*encoded == '/') && (encoded[1] == '/')) {
      pcVar7 = encoded + 2;
      lVar12 = 0;
      lVar9 = 0;
      while( true ) {
        bVar2 = pcVar7[lVar12];
        if (((ulong)bVar2 < 0x40) && ((0x8000800800000001U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          pcVar5 = pcVar7 + -lVar9;
          if (lVar9 == 0) goto LAB_001d5fca;
          pcVar10 = encoded + (3 - lVar9);
          sVar11 = 0xffffffffffffffff;
          goto LAB_001d60e5;
        }
        bVar13 = is_authority_character(this,(int)(char)bVar2);
        if (!bVar13) break;
        lVar9 = lVar9 + -1;
        lVar12 = lVar12 + 1;
      }
    }
    else {
LAB_001d5fca:
      if ((*pcVar5 != 0x2f) && (bVar13 = is_path_character(this,(int)*pcVar5), !bVar13)) {
LAB_001d6020:
        if (*pcVar5 == '?') {
          pcVar5 = pcVar5 + 1;
          for (sVar11 = 0; (cVar1 = pcVar5[sVar11], cVar1 != '\0' && (cVar1 != '#'));
              sVar11 = sVar11 + 1) {
            bVar13 = is_path_character(this,(int)cVar1);
            if ((cVar1 != '?') && (!bVar13)) {
              return false;
            }
          }
          (this->query)._M_len = sVar11;
          (this->query)._M_str = pcVar5;
          pcVar5 = pcVar5 + sVar11;
        }
        if (*pcVar5 == '#') {
          pcVar7 = pcVar5 + 1;
          cVar1 = pcVar5[1];
          bVar13 = cVar1 == '\0';
          pcVar10 = pcVar7;
          if (bVar13) {
LAB_001d6157:
            (this->fragment)._M_len = (long)pcVar10 - (long)pcVar7;
            (this->fragment)._M_str = pcVar7;
          }
          else {
            bVar3 = is_path_character(this,(int)cVar1);
            if ((cVar1 == '?') || (bVar3)) {
              pcVar10 = pcVar5 + 2;
              do {
                cVar1 = *pcVar10;
                bVar13 = cVar1 == '\0';
                if (bVar13) goto LAB_001d6157;
                bVar3 = is_path_character(this,(int)cVar1);
                pcVar10 = pcVar10 + 1;
              } while ((cVar1 == '?') || (bVar3));
            }
          }
          if (!bVar13) {
            return false;
          }
        }
        return true;
      }
      sVar11 = 0;
      while( true ) {
        bVar2 = pcVar5[sVar11];
        if (((ulong)bVar2 < 0x40) && ((0x8000000800000001U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          (this->path)._M_len = sVar11;
          (this->path)._M_str = pcVar5;
          pcVar5 = pcVar5 + sVar11;
          goto LAB_001d6020;
        }
        bVar13 = is_path_character(this,(int)(char)bVar2);
        if (!bVar13) break;
        sVar11 = sVar11 + 1;
      }
    }
  }
  return false;
}

Assistant:

bool parse_from(const char *encoded) {
    const char *p = encoded;

    // IMPORTANT -- A uri may either be an absolute uri, or an
    // relative-reference Absolute: 'http://host.com' Relative-Reference:
    // '//:host.com', '/path1/path2?query', './path1:path2' A Relative-Reference
    // can be disambiguated by parsing for a ':' before the first slash

    bool is_relative_reference = true;
    const char *p2 = p;
    for (; *p2 != ('/') && *p2 != ('\0'); p2++) {
      if (*p2 == (':')) {
        // found a colon, the first portion is a scheme
        is_relative_reference = false;
        break;
      }
    }

    if (!is_relative_reference) {
      // the first character of a scheme must be a letter
      if (!isalpha(*p)) {
        return false;
      }

      // start parsing the scheme, it's always delimited by a colon (must be
      // present)
      auto scheme_begin = p++;
      for (; *p != ':'; p++) {
        if (!is_scheme_character(*p)) {
          return false;
        }
      }
      auto scheme_end = p;
      schema = std::string_view(scheme_begin, scheme_end - scheme_begin);
      is_ssl = (schema == "https" || schema == "wss");

      // skip over the colon
      p++;
    }

    // the uri must have http or https
    if (schema.empty()) {
      return false;
    }

    // if we see two slashes next, then we're going to parse the authority
    // portion later on we'll break up the authority into the port and host
    const char *authority_begin = nullptr;
    const char *authority_end = nullptr;
    if (*p == ('/') && p[1] == ('/')) {
      // skip over the slashes
      p += 2;
      authority_begin = p;

      // the authority is delimited by a slash (resource), question-mark (query)
      // or octothorpe (fragment) or by EOS. The authority could be empty
      // ('file:///C:\file_name.txt')
      for (; *p != ('/') && *p != ('?') && *p != ('#') && *p != ('\0'); p++) {
        // We're NOT currently supporting IPvFuture or username/password in
        // authority IPv6 as the host (i.e. http://[:::::::]) is allowed as
        // valid URI and passed to subsystem for support.
        if (!is_authority_character(*p)) {
          return false;
        }
      }
      authority_end = p;

      // now lets see if we have a port specified -- by working back from the
      // end
      if (authority_begin != authority_end) {
        // the port is made up of all digits
        const char *port_begin = authority_end - 1;
        for (; isdigit(*port_begin) && port_begin != authority_begin;
             port_begin--) {
        }

        const char *host_begin = nullptr;
        const char *host_end = nullptr;
        if (*port_begin == (':')) {
          // has a port
          host_begin = authority_begin;
          host_end = port_begin;

          // skip the colon
          port_begin++;

          port = std::string_view(port_begin, authority_end - port_begin);
        }
        else {
          // no port
          host_begin = authority_begin;
          host_end = authority_end;
        }

        // look for a user_info component
        const char *u_end = host_begin;
        for (; is_user_info_character(*u_end) && u_end != host_end; u_end++) {
        }

        if (*u_end == ('@')) {
          host_begin = u_end + 1;
          auto uinfo_begin = authority_begin;
          auto uinfo_end = u_end;
          uinfo = std::string_view(uinfo_begin, uinfo_end - uinfo_begin);
        }
        host = std::string_view(host_begin, host_end - host_begin);
      }
    }

    // if we see a path character or a slash, then the
    // if we see a slash, or any other legal path character, parse the path next
    if (*p == ('/') || is_path_character(*p)) {
      auto path_begin = p;

      // the path is delimited by a question-mark (query) or octothorpe
      // (fragment) or by EOS
      for (; *p != ('?') && *p != ('#') && *p != ('\0'); p++) {
        if (!is_path_character(*p)) {
          return false;
        }
      }
      auto path_end = p;
      path = std::string_view(path_begin, path_end - path_begin);
    }

    // if we see a ?, then the query is next
    if (*p == ('?')) {
      // skip over the question mark
      p++;
      auto query_begin = p;

      // the query is delimited by a '#' (fragment) or EOS
      for (; *p != ('#') && *p != ('\0'); p++) {
        if (!is_query_character(*p)) {
          return false;
        }
      }
      auto query_end = p;
      query = std::string_view(query_begin, query_end - query_begin);
    }

    // if we see a #, then the fragment is next
    if (*p == ('#')) {
      // skip over the hash mark
      p++;
      auto fragment_begin = p;

      // the fragment is delimited by EOS
      for (; *p != ('\0'); p++) {
        if (!is_fragment_character(*p)) {
          return false;
        }
      }
      auto fragment_end = p;
      fragment =
          std::string_view(fragment_begin, fragment_end - fragment_begin);
    }

    return true;
  }